

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

void flush_bits_e(huff_entropy_ptr entropy)

{
  size_t *psVar1;
  JOCTET *pJVar2;
  int iVar3;
  ulong uVar4;
  
  if ((entropy->gather_statistics == 0) && (iVar3 = (entropy->saved).put_bits, 0 < iVar3)) {
    uVar4 = 0x7fL << (0x11U - (char)iVar3 & 0x3f) | (entropy->saved).put_buffer;
    iVar3 = iVar3 + 0xf;
    do {
      pJVar2 = entropy->next_output_byte;
      entropy->next_output_byte = pJVar2 + 1;
      *pJVar2 = (JOCTET)(uVar4 >> 0x10);
      psVar1 = &entropy->free_in_buffer;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        dump_buffer_e(entropy);
      }
      if ((~(uint)uVar4 & 0xff0000) == 0) {
        pJVar2 = entropy->next_output_byte;
        entropy->next_output_byte = pJVar2 + 1;
        *pJVar2 = '\0';
        psVar1 = &entropy->free_in_buffer;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          dump_buffer_e(entropy);
        }
      }
      uVar4 = uVar4 << 8;
      iVar3 = iVar3 + -8;
    } while (0xf < iVar3);
  }
  (entropy->saved).put_buffer = 0;
  (entropy->saved).put_bits = 0;
  return;
}

Assistant:

LOCAL(void)
flush_bits_e (huff_entropy_ptr entropy)
{
  emit_bits_e(entropy, 0x7F, 7); /* fill any partial byte with ones */
  entropy->saved.put_buffer = 0; /* and reset bit-buffer to empty */
  entropy->saved.put_bits = 0;
}